

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

void __thiscall Moc::parsePropertyAttributes(Moc *this,PropertyDef *propDef)

{
  byte bVar1;
  Symbol *pSVar2;
  undefined1 *puVar3;
  long lVar4;
  long lVar5;
  Symbol *pSVar6;
  Data *pDVar7;
  Data *pDVar8;
  qsizetype qVar9;
  bool bVar10;
  QTypeRevision QVar11;
  uint uVar12;
  long lVar13;
  QArrayData *pQVar14;
  QStringBuilder<QByteArray_&,_QByteArray_&> *rhs;
  char *pcVar15;
  QByteArray *pQVar16;
  long in_FS_OFFSET;
  bool ok;
  QStringBuilder<QByteArray_&,_QByteArray_&> local_c8;
  QByteArray local_b8;
  QByteArray local_98;
  QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[63]> local_78;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar13 = (this->super_Parser).index;
  if (lVar13 < (this->super_Parser).symbols.d.size) {
    do {
      if ((this->super_Parser).symbols.d.ptr[lVar13].token != IDENTIFIER) break;
      (this->super_Parser).index = lVar13 + 1;
      pSVar2 = (this->super_Parser).symbols.d.ptr;
      pQVar16 = &pSVar2[lVar13].lex;
      local_78.b = (char (*) [63])&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.a = (char (*) [22])&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.b = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::mid((QByteArray *)&local_78,pQVar16,*(qsizetype *)(pQVar16 + 1),
                      *(qsizetype *)((long)(pQVar16 + 1) + 8));
      if (*(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d == 'C') {
        local_58.d.d = (Data *)0x17c462;
        bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (!bVar10) goto LAB_0012dc9c;
        propDef->constant = true;
        goto LAB_0012ddf2;
      }
LAB_0012dc9c:
      if (*(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d == 'F') {
        local_58.d.d = (Data *)0x17b724;
        bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (bVar10) {
          propDef->final = true;
          goto LAB_0012ddf2;
        }
      }
      if (*(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d == 'N') {
        local_58.d.d = (Data *)0x17c46b;
        bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (!bVar10) goto LAB_0012ddb7;
        lVar13 = (this->super_Parser).index;
        if (((this->super_Parser).symbols.d.size <= lVar13) ||
           (pSVar2 = (this->super_Parser).symbols.d.ptr, pSVar2[lVar13].token != IDENTIFIER))
        goto LAB_0012ec19;
        (this->super_Parser).index = lVar13 + 1;
        QByteArray::mid(&local_58,&pSVar2[lVar13].lex,pSVar2[lVar13].from,pSVar2[lVar13].len);
        pQVar14 = &((propDef->name).d.d)->super_QArrayData;
        pQVar16 = (QByteArray *)(propDef->name).d.ptr;
        (propDef->name).d.d = local_58.d.d;
        (propDef->name).d.ptr = local_58.d.ptr;
        puVar3 = (undefined1 *)(propDef->name).d.size;
        (propDef->name).d.size = local_58.d.size;
        local_58.d.d = (Data *)pQVar14;
        local_58.d.ptr = (char *)pQVar16;
        local_58.d.size = (qsizetype)puVar3;
        if (pQVar14 == (QArrayData *)0x0) goto LAB_0012ddf2;
        LOCK();
        (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_0012ddf2;
        goto LAB_0012e7c5;
      }
LAB_0012ddb7:
      if (*(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d == 'R') {
        local_58.d.d = (Data *)0x17c470;
        bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (!bVar10) goto LAB_0012de2e;
        propDef->required = true;
        goto LAB_0012ddf2;
      }
LAB_0012de2e:
      if (*(char *)&(((QByteArray *)&(local_78.a.b)->d)->d).d == 'R') {
        local_58.d.d = (Data *)0x17c479;
        bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (((bVar10) &&
            (lVar4 = (this->super_Parser).index, lVar4 < (this->super_Parser).symbols.d.size)) &&
           ((this->super_Parser).symbols.d.ptr[lVar4].token == LPAREN)) {
          (this->super_Parser).index = lVar4 + 1;
          (this->super_Parser).index = lVar4;
          QVar11 = parseRevision(this);
          propDef->revision = (uint)(ushort)QVar11;
          goto LAB_0012ddf2;
        }
      }
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (char *)0x0;
      local_98.d.size = 0;
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = (char *)0x0;
      local_b8.d.size = 0;
      lVar4 = (this->super_Parser).symbols.d.size;
      lVar5 = (this->super_Parser).index;
      if ((lVar5 < lVar4) && ((this->super_Parser).symbols.d.ptr[lVar5].token == LPAREN)) {
        (this->super_Parser).index = lVar5 + 1;
        lexemUntil(&local_58,this,PP_RPAREN);
        qVar9 = local_58.d.size;
        pDVar8 = local_58.d.d;
        pcVar15 = local_98.d.ptr;
        pDVar7 = local_98.d.d;
        local_58.d.d = local_98.d.d;
        local_98.d.d = pDVar8;
        local_98.d.ptr = local_58.d.ptr;
        local_58.d.ptr = pcVar15;
        local_58.d.size = local_98.d.size;
        local_98.d.size = qVar9;
        if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar7->super_QArrayData,1,0x10);
          }
        }
        QByteArray::mid(&local_58,&local_98,1,(qsizetype)(local_98.d.size + -2));
        qVar9 = local_58.d.size;
        pcVar15 = local_98.d.ptr;
        pQVar14 = &(local_98.d.d)->super_QArrayData;
        local_98.d.d = local_58.d.d;
        local_98.d.ptr = local_58.d.ptr;
        local_58.d.ptr = pcVar15;
        local_58.d.size = local_98.d.size;
        local_98.d.size = qVar9;
LAB_0012e28a:
        local_58.d.d = (Data *)pQVar14;
        if (pQVar14 != (QArrayData *)0x0) {
          LOCK();
          (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar14,1,0x10);
          }
        }
      }
      else {
        lVar5 = (this->super_Parser).index;
        if ((lVar5 < lVar4) && ((this->super_Parser).symbols.d.ptr[lVar5].token == INTEGER_LITERAL))
        {
          (this->super_Parser).index = lVar5 + 1;
          pSVar6 = (this->super_Parser).symbols.d.ptr;
          QByteArray::mid(&local_58,&pSVar6[lVar5].lex,pSVar6[lVar5].from,pSVar6[lVar5].len);
          qVar9 = local_58.d.size;
          pDVar8 = local_58.d.d;
          pcVar15 = local_98.d.ptr;
          pDVar7 = local_98.d.d;
          local_58.d.d = local_98.d.d;
          local_98.d.d = pDVar8;
          local_98.d.ptr = local_58.d.ptr;
          local_58.d.ptr = pcVar15;
          local_58.d.size = local_98.d.size;
          local_98.d.size = qVar9;
          if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar7->super_QArrayData,1,0x10);
            }
          }
          local_58.d.d = (Data *)0x17c479;
          rhs = (QStringBuilder<QByteArray_&,_QByteArray_&> *)&local_58;
LAB_0012e15f:
          bVar10 = operator!=((QByteArray *)&local_78,(char **)rhs);
          if (bVar10) goto switchD_0012e327_caseD_4f;
        }
        else {
          lVar5 = (this->super_Parser).index;
          if ((lVar5 < lVar4) && ((this->super_Parser).symbols.d.ptr[lVar5].token == DEFAULT)) {
            (this->super_Parser).index = lVar5 + 1;
            pSVar6 = (this->super_Parser).symbols.d.ptr;
            QByteArray::mid(&local_58,&pSVar6[lVar5].lex,pSVar6[lVar5].from,pSVar6[lVar5].len);
            qVar9 = local_58.d.size;
            pDVar8 = local_58.d.d;
            pcVar15 = local_98.d.ptr;
            pDVar7 = local_98.d.d;
            local_58.d.d = local_98.d.d;
            local_98.d.d = pDVar8;
            local_98.d.ptr = local_58.d.ptr;
            local_58.d.ptr = pcVar15;
            local_58.d.size = local_98.d.size;
            local_98.d.size = qVar9;
            if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar7->super_QArrayData,1,0x10);
              }
            }
            local_58.d.d = (Data *)0x17c482;
            bVar10 = operator!=((QByteArray *)&local_78,(char **)&local_58);
            if (bVar10) {
              local_c8.a = (QByteArray *)0x17c487;
              rhs = &local_c8;
              goto LAB_0012e15f;
            }
          }
          else {
            lVar5 = (this->super_Parser).index;
            if ((lVar4 <= lVar5) ||
               (pSVar6 = (this->super_Parser).symbols.d.ptr, pSVar6[lVar5].token != IDENTIFIER)) {
LAB_0012ec19:
              Parser::error(&this->super_Parser,(char *)0x0);
            }
            (this->super_Parser).index = lVar5 + 1;
            QByteArray::mid(&local_58,&pSVar6[lVar5].lex,pSVar6[lVar5].from,pSVar6[lVar5].len);
            qVar9 = local_58.d.size;
            pDVar8 = local_58.d.d;
            pcVar15 = local_98.d.ptr;
            pDVar7 = local_98.d.d;
            local_58.d.d = local_98.d.d;
            local_98.d.d = pDVar8;
            local_98.d.ptr = local_58.d.ptr;
            local_58.d.ptr = pcVar15;
            local_58.d.size = local_98.d.size;
            local_98.d.size = qVar9;
            if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar7->super_QArrayData,1,0x10);
              }
            }
            lVar4 = (this->super_Parser).index;
            if ((lVar4 < (this->super_Parser).symbols.d.size) &&
               ((this->super_Parser).symbols.d.ptr[lVar4].token == LPAREN)) {
              (this->super_Parser).index = lVar4 + 1;
              lexemUntil(&local_58,this,PP_RPAREN);
              qVar9 = local_58.d.size;
              pcVar15 = local_b8.d.ptr;
              pQVar14 = &(local_b8.d.d)->super_QArrayData;
              local_b8.d.d = local_58.d.d;
              local_b8.d.ptr = local_58.d.ptr;
              local_58.d.ptr = pcVar15;
              local_58.d.size = local_b8.d.size;
              local_b8.d.size = qVar9;
              goto LAB_0012e28a;
            }
            local_58.d.d = (Data *)0x17c42c;
            bVar10 = operator!=(&local_98,(char **)&local_58);
            if (bVar10) {
              local_c8.a = (QByteArray *)0x178f69;
              bVar10 = operator!=(&local_98,(char **)&local_c8);
              if (bVar10) {
                QByteArray::operator=(&local_b8,"()");
              }
            }
          }
        }
      }
      bVar1 = *(byte *)&(((QByteArray *)&(local_78.a.b)->d)->d).d;
      if (10 < bVar1 - 0x4d) {
        if (bVar1 == 0x42) {
          local_58.d.d = (Data *)0x17c4ac;
          bVar10 = operator!=((QByteArray *)&local_78,(char **)&local_58);
          pQVar16 = &propDef->bind;
          if (bVar10) goto switchD_0012e327_caseD_4f;
          goto LAB_0012e77e;
        }
        if (bVar1 != 0x44) goto switchD_0012e327_caseD_4f;
        local_58.d.d = (Data *)0x17c4b5;
        bVar10 = operator!=((QByteArray *)&local_78,(char **)&local_58);
        if (bVar10) goto switchD_0012e327_caseD_4f;
        local_c8.b = &local_b8;
        local_c8.a = &local_98;
        QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>(&local_58,&local_c8);
        pQVar14 = &((propDef->designable).d.d)->super_QArrayData;
        pQVar16 = (QByteArray *)(propDef->designable).d.ptr;
        (propDef->designable).d.d = local_58.d.d;
        (propDef->designable).d.ptr = local_58.d.ptr;
        puVar3 = (undefined1 *)(propDef->designable).d.size;
        (propDef->designable).d.size = local_58.d.size;
        local_58.d.d = (Data *)pQVar14;
        local_58.d.ptr = (char *)pQVar16;
        local_58.d.size = (qsizetype)puVar3;
        if (pQVar14 != (QArrayData *)0x0) {
          LOCK();
          (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar14,1,0x10);
          }
        }
        lVar13 = (propDef->designable).d.size;
        if ((lVar13 != 0) && ((propDef->designable).d.ptr[lVar13 + -1] == ')')) {
          local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray(&local_58,"Providing a function for ",-1);
          pcVar15 = "DESIGNABLE";
          goto LAB_0012ed38;
        }
        goto LAB_0012e786;
      }
      switch((uint)bVar1) {
      case 0x4d:
        local_58.d.d = (Data *)0x17c48d;
        bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
        pQVar16 = &propDef->member;
        if (!bVar10) goto switchD_0012e327_caseD_4f;
        break;
      case 0x4e:
        local_58.d.d = (Data *)0x17c4c0;
        bVar10 = operator!=((QByteArray *)&local_78,(char **)&local_58);
        pQVar16 = &propDef->notify;
        if (bVar10) goto switchD_0012e327_caseD_4f;
        break;
      default:
switchD_0012e327_caseD_4f:
        Parser::error(&this->super_Parser,pSVar2 + lVar13);
      case 0x52:
        local_58.d.d = (Data *)0x17c482;
        bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
        pQVar16 = &propDef->read;
        if (!bVar10) {
          local_58.d.d = (Data *)0x17c494;
          bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
          pQVar16 = &propDef->reset;
          if (!bVar10) {
            local_58.d.d = (Data *)0x17c479;
            bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
            if (!bVar10) goto switchD_0012e327_caseD_4f;
            local_58.d.d = (Data *)((ulong)local_58.d.d & 0xffffffffffffff00);
            uVar12 = QByteArray::toInt(&local_98,(bool *)&local_58,10);
            if ((0xfe < uVar12) || ((char)local_58.d.d == '\0')) goto switchD_0012e327_caseD_4f;
            propDef->revision = uVar12 | 0xff00;
            goto LAB_0012e786;
          }
        }
        break;
      case 0x53:
        local_58.d.d = (Data *)0x17c49a;
        bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
        if (bVar10) {
          local_c8.b = &local_b8;
          local_c8.a = &local_98;
          QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>(&local_58,&local_c8);
          pQVar14 = &((propDef->scriptable).d.d)->super_QArrayData;
          pQVar16 = (QByteArray *)(propDef->scriptable).d.ptr;
          (propDef->scriptable).d.d = local_58.d.d;
          (propDef->scriptable).d.ptr = local_58.d.ptr;
          puVar3 = (undefined1 *)(propDef->scriptable).d.size;
          (propDef->scriptable).d.size = local_58.d.size;
          local_58.d.d = (Data *)pQVar14;
          local_58.d.ptr = (char *)pQVar16;
          local_58.d.size = (qsizetype)puVar3;
          if (pQVar14 != (QArrayData *)0x0) {
            LOCK();
            (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar14,1,0x10);
            }
          }
          lVar13 = (propDef->scriptable).d.size;
          if ((lVar13 != 0) && ((propDef->scriptable).d.ptr[lVar13 + -1] == ')')) {
            local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray(&local_58,"Providing a function for ",-1);
            pcVar15 = "SCRIPTABLE";
LAB_0012ed38:
            QByteArray::operator+=(&local_58,pcVar15);
            QByteArray::operator+=
                      (&local_58," in a property declaration is not be supported in Qt 6.");
            pcVar15 = local_58.d.ptr;
            if ((QByteArray *)local_58.d.ptr == (QByteArray *)0x0) {
              pcVar15 = "";
            }
            Parser::error(&this->super_Parser,pcVar15);
          }
        }
        else {
          local_58.d.d = (Data *)0x17c4a5;
          bVar10 = operator==((QByteArray *)&local_78,(char **)&local_58);
          if (!bVar10) goto switchD_0012e327_caseD_4f;
          local_c8.b = &local_b8;
          local_c8.a = &local_98;
          QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>(&local_58,&local_c8);
          pQVar14 = &((propDef->stored).d.d)->super_QArrayData;
          pQVar16 = (QByteArray *)(propDef->stored).d.ptr;
          (propDef->stored).d.d = local_58.d.d;
          (propDef->stored).d.ptr = local_58.d.ptr;
          puVar3 = (undefined1 *)(propDef->stored).d.size;
          (propDef->stored).d.size = local_58.d.size;
          local_58.d.d = (Data *)pQVar14;
          local_58.d.ptr = (char *)pQVar16;
          local_58.d.size = (qsizetype)puVar3;
          if (pQVar14 != (QArrayData *)0x0) {
            LOCK();
            (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar14,1,0x10);
            }
          }
          lVar13 = (propDef->stored).d.size;
          if ((lVar13 != 0) && ((propDef->stored).d.ptr[lVar13 + -1] == ')')) {
            local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::QByteArray(&local_58,"Providing a function for ",-1);
            pcVar15 = "STORED";
            goto LAB_0012ed38;
          }
        }
        goto LAB_0012e786;
      case 0x55:
        local_58.d.d = (Data *)0x17c4c7;
        bVar10 = operator!=((QByteArray *)&local_78,(char **)&local_58);
        if (bVar10) goto switchD_0012e327_caseD_4f;
        local_c8.b = &local_b8;
        local_c8.a = &local_98;
        QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>(&local_58,&local_c8);
        pQVar14 = &((propDef->user).d.d)->super_QArrayData;
        pQVar16 = (QByteArray *)(propDef->user).d.ptr;
        (propDef->user).d.d = local_58.d.d;
        (propDef->user).d.ptr = local_58.d.ptr;
        puVar3 = (undefined1 *)(propDef->user).d.size;
        (propDef->user).d.size = local_58.d.size;
        local_58.d.d = (Data *)pQVar14;
        local_58.d.ptr = (char *)pQVar16;
        local_58.d.size = (qsizetype)puVar3;
        if (pQVar14 != (QArrayData *)0x0) {
          LOCK();
          (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar14,1,0x10);
          }
        }
        lVar13 = (propDef->user).d.size;
        if ((lVar13 != 0) && ((propDef->user).d.ptr[lVar13 + -1] == ')')) {
          local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray(&local_58,"Providing a function for ",-1);
          pcVar15 = "USER";
          goto LAB_0012ed38;
        }
        goto LAB_0012e786;
      case 0x57:
        local_58.d.d = (Data *)0x17c487;
        bVar10 = operator!=((QByteArray *)&local_78,(char **)&local_58);
        pQVar16 = &propDef->write;
        if (bVar10) goto switchD_0012e327_caseD_4f;
      }
LAB_0012e77e:
      QByteArray::operator=(pQVar16,&local_98);
LAB_0012e786:
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        pQVar14 = &(local_98.d.d)->super_QArrayData;
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_0012e7c5:
          QArrayData::deallocate(pQVar14,1,0x10);
        }
      }
LAB_0012ddf2:
      if ((QArrayData *)local_78.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)*local_78.a.a)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)*local_78.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)*local_78.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78.a.a,1,0x10);
        }
      }
      lVar13 = (this->super_Parser).index;
    } while (lVar13 < (this->super_Parser).symbols.d.size);
  }
  if ((propDef->constant == true) && ((propDef->write).d.ptr != (char *)0x0)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a = (char (*) [22])0x17c4cc;
    local_78.b = (char (*) [63])0x17c4e2;
    local_78.a.b = &propDef->name;
    QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[59]>::
    convertTo<QByteArray>
              (&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[59]>
                *)&local_78);
    propDef->constant = false;
    pcVar15 = local_58.d.ptr;
    if ((QByteArray *)local_58.d.ptr == (QByteArray *)0x0) {
      pcVar15 = "";
    }
    Parser::warning(&this->super_Parser,pcVar15);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if ((propDef->constant == true) && ((propDef->notify).d.ptr != (char *)0x0)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a = (char (*) [22])0x17c4cc;
    local_78.b = (char (*) [63])0x17c51d;
    local_78.a.b = &propDef->name;
    QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[60]>::
    convertTo<QByteArray>
              (&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[60]>
                *)&local_78);
    propDef->constant = false;
    pcVar15 = local_58.d.ptr;
    if ((QByteArray *)local_58.d.ptr == (QByteArray *)0x0) {
      pcVar15 = "";
    }
    Parser::warning(&this->super_Parser,pcVar15);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if ((propDef->constant == true) && ((propDef->bind).d.ptr != (char *)0x0)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a = (char (*) [22])0x17c4cc;
    local_78.b = (char (*) [63])0x17c559;
    local_78.a.b = &propDef->name;
    QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[58]>::
    convertTo<QByteArray>
              (&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[58]>
                *)&local_78);
    propDef->constant = false;
    pcVar15 = local_58.d.ptr;
    if ((QByteArray *)local_58.d.ptr == (QByteArray *)0x0) {
      pcVar15 = "";
    }
    Parser::warning(&this->super_Parser,pcVar15);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  local_58.d.d = (Data *)0x1799d7;
  bVar10 = operator==(&propDef->read,(char **)&local_58);
  if ((bVar10) && ((propDef->bind).d.ptr == (char *)0x0)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a = (char (*) [22])0x17c4cc;
    local_78.b = (char (*) [63])0x17c593;
    local_78.a.b = &propDef->name;
    QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[61]>::
    convertTo<QByteArray>
              (&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[61]>
                *)&local_78);
    QByteArray::operator=(&propDef->read,"");
    pcVar15 = local_58.d.ptr;
    if ((QByteArray *)local_58.d.ptr == (QByteArray *)0x0) {
      pcVar15 = "";
    }
    Parser::warning(&this->super_Parser,pcVar15);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  local_58.d.d = (Data *)0x1799d7;
  bVar10 = operator==(&propDef->write,(char **)&local_58);
  if ((bVar10) && ((propDef->bind).d.ptr == (char *)0x0)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a.a = (char (*) [22])0x17c4cc;
    local_78.b = (char (*) [63])0x17c5d0;
    local_78.a.b = &propDef->name;
    QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[63]>::
    convertTo<QByteArray>(&local_58,&local_78);
    QByteArray::operator=(&propDef->write,"");
    pcVar15 = local_58.d.ptr;
    if ((QByteArray *)local_58.d.ptr == (QByteArray *)0x0) {
      pcVar15 = "";
    }
    Parser::warning(&this->super_Parser,pcVar15);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Moc::parsePropertyAttributes(PropertyDef &propDef)
{
    auto checkIsFunction = [&](const QByteArray &def, const char *name) {
        if (def.endsWith(')')) {
            QByteArray msg = "Providing a function for ";
            msg += name;
            msg += " in a property declaration is not be supported in Qt 6.";
            error(msg.constData());
        }
    };

    while (test(IDENTIFIER)) {
        const Symbol &lsym = symbol();
        const QByteArray l = lsym.lexem();
        if (l[0] == 'C' && l == "CONSTANT") {
            propDef.constant = true;
            continue;
        } else if (l[0] == 'F' && l == "FINAL") {
            propDef.final = true;
            continue;
        } else if (l[0] == 'N' && l == "NAME") {
            next(IDENTIFIER);
            propDef.name = lexem();
            continue;
        } else if (l[0] == 'R' && l == "REQUIRED") {
            propDef.required = true;
            continue;
        } else if (l[0] == 'R' && l == "REVISION" && test(LPAREN)) {
            prev();
            propDef.revision = parseRevision().toEncodedVersion<int>();
            continue;
        }

        QByteArray v, v2;
        if (test(LPAREN)) {
            v = lexemUntil(RPAREN);
            v = v.mid(1, v.size() - 2); // removes the '(' and ')'
        } else if (test(INTEGER_LITERAL)) {
            v = lexem();
            if (l != "REVISION")
                error(lsym);
        } else if (test(DEFAULT)) {
            v = lexem();
            if (l != "READ" && l != "WRITE")
                error(lsym);
        } else {
            next(IDENTIFIER);
            v = lexem();
            if (test(LPAREN))
                v2 = lexemUntil(RPAREN);
            else if (v != "true" && v != "false")
                v2 = "()";
        }
        switch (l[0]) {
        case 'M':
            if (l == "MEMBER")
                propDef.member = v;
            else
                error(lsym);
            break;
        case 'R':
            if (l == "READ")
                propDef.read = v;
            else if (l == "RESET")
                propDef.reset = v;
            else if (l == "REVISION") {
                bool ok = false;
                const int minor = v.toInt(&ok);
                if (!ok || !QTypeRevision::isValidSegment(minor))
                    error(lsym);
                propDef.revision = QTypeRevision::fromMinorVersion(minor).toEncodedVersion<int>();
            } else
                error(lsym);
            break;
        case 'S':
            if (l == "SCRIPTABLE") {
                propDef.scriptable = v + v2;
                checkIsFunction(propDef.scriptable, "SCRIPTABLE");
            } else if (l == "STORED") {
                propDef.stored = v + v2;
                checkIsFunction(propDef.stored, "STORED");
            } else
                error(lsym);
            break;
        case 'W': if (l != "WRITE") error(lsym);
            propDef.write = v;
            break;
        case 'B': if (l != "BINDABLE") error(lsym);
            propDef.bind = v;
            break;
        case 'D': if (l != "DESIGNABLE") error(lsym);
            propDef.designable = v + v2;
            checkIsFunction(propDef.designable, "DESIGNABLE");
            break;
        case 'N': if (l != "NOTIFY") error(lsym);
            propDef.notify = v;
            break;
        case 'U': if (l != "USER") error(lsym);
            propDef.user = v + v2;
            checkIsFunction(propDef.user, "USER");
            break;
        default:
            error(lsym);
        }
    }
    if (propDef.constant && !propDef.write.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both WRITEable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.constant && !propDef.notify.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both NOTIFYable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.constant && !propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both BINDable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.read == "default" && propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is not BINDable but default-READable. READ will be ignored.";
        propDef.read = "";
        warning(msg.constData());
    }
    if (propDef.write == "default" && propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is not BINDable but default-WRITEable. WRITE will be ignored.";
        propDef.write = "";
        warning(msg.constData());
    }
}